

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O0

void uiter_setState_63(UCharIterator *iter,uint32_t state,UErrorCode *pErrorCode)

{
  UBool UVar1;
  UErrorCode *pErrorCode_local;
  uint32_t state_local;
  UCharIterator *iter_local;
  
  if ((pErrorCode != (UErrorCode *)0x0) && (UVar1 = U_FAILURE(*pErrorCode), UVar1 == '\0')) {
    if (iter == (UCharIterator *)0x0) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else if (iter->setState == (UCharIteratorSetState *)0x0) {
      *pErrorCode = U_UNSUPPORTED_ERROR;
    }
    else {
      (*iter->setState)(iter,state,pErrorCode);
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
uiter_setState(UCharIterator *iter, uint32_t state, UErrorCode *pErrorCode) {
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        /* do nothing */
    } else if(iter==NULL) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
    } else if(iter->setState==NULL) {
        *pErrorCode=U_UNSUPPORTED_ERROR;
    } else {
        iter->setState(iter, state, pErrorCode);
    }
}